

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Gia_ManComputeEdgeDelay(Gia_Man_t *p,int fUseTwo)

{
  ulong uVar1;
  Tim_Man_t *pTVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  float fVar9;
  
  Vec_IntFreeP(&p->vEdgeDelay);
  Vec_IntFreeP(&p->vEdge1);
  Vec_IntFreeP(&p->vEdge2);
  pVVar7 = Vec_IntStart(p->nObjs);
  p->vEdge1 = pVVar7;
  pVVar7 = Vec_IntStart(p->nObjs);
  p->vEdge2 = pVVar7;
  pVVar7 = Vec_IntStart(p->nObjs);
  p->vEdgeDelay = pVVar7;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    if (p->vMapping2 == (Vec_Wec_t *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0x1d7,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
    }
    if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
      iVar3 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime);
      if (iVar3 != 0) {
        pVVar7 = Gia_ManOrderWithBoxes(p);
        Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
        for (iVar3 = 0; iVar3 < pVVar7->nSize; iVar3 = iVar3 + 1) {
          iVar4 = Vec_IntEntry(pVVar7,iVar3);
          pGVar8 = Gia_ManObj(p,iVar4);
          if (pGVar8 == (Gia_Obj_t *)0x0) break;
          iVar4 = Gia_ObjId(p,pGVar8);
          uVar1 = *(ulong *)pGVar8;
          uVar5 = (uint)uVar1;
          if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar5 < 0) {
            if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
              pTVar2 = (Tim_Man_t *)p->pManTime;
              iVar6 = Gia_ObjCioId(pGVar8);
              fVar9 = Tim_ManGetCiArrival(pTVar2,iVar6);
              Vec_IntWriteEntry(p->vEdgeDelay,iVar4,(int)fVar9);
            }
            else if ((int)uVar5 < 0 && (int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
              iVar4 = Vec_IntEntry(p->vEdgeDelay,iVar4 - (uVar5 & 0x1fffffff));
              pTVar2 = (Tim_Man_t *)p->pManTime;
              iVar6 = Gia_ObjCioId(pGVar8);
              Tim_ManSetCoArrival(pTVar2,iVar6,(float)iVar4);
            }
            else if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                            ,0x1cd,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
            }
          }
          else {
            iVar6 = Gia_ObjIsLut2(p,iVar4);
            if (iVar6 != 0) {
              Gia_ObjComputeEdgeDelay(p,iVar4,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
            }
          }
        }
        goto LAB_001e26b7;
      }
    }
    for (iVar3 = 1; iVar3 < p->nObjs; iVar3 = iVar3 + 1) {
      iVar4 = Gia_ObjIsLut2(p,iVar3);
      if (iVar4 != 0) {
        Gia_ObjComputeEdgeDelay(p,iVar3,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
      }
    }
  }
  else {
    if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
      iVar3 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime);
      if (iVar3 != 0) {
        pVVar7 = Gia_ManOrderWithBoxes(p);
        Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
        for (iVar3 = 0; iVar3 < pVVar7->nSize; iVar3 = iVar3 + 1) {
          iVar4 = Vec_IntEntry(pVVar7,iVar3);
          pGVar8 = Gia_ManObj(p,iVar4);
          if (pGVar8 == (Gia_Obj_t *)0x0) break;
          iVar4 = Gia_ObjId(p,pGVar8);
          uVar1 = *(ulong *)pGVar8;
          uVar5 = (uint)uVar1;
          if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar5 < 0) {
            if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
              pTVar2 = (Tim_Man_t *)p->pManTime;
              iVar6 = Gia_ObjCioId(pGVar8);
              fVar9 = Tim_ManGetCiArrival(pTVar2,iVar6);
              Vec_IntWriteEntry(p->vEdgeDelay,iVar4,(int)fVar9);
            }
            else if ((int)uVar5 < 0 && (int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
              iVar4 = Vec_IntEntry(p->vEdgeDelay,iVar4 - (uVar5 & 0x1fffffff));
              pTVar2 = (Tim_Man_t *)p->pManTime;
              iVar6 = Gia_ObjCioId(pGVar8);
              Tim_ManSetCoArrival(pTVar2,iVar6,(float)iVar4);
            }
            else if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                            ,0x1a9,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
            }
          }
          else {
            iVar6 = Gia_ObjIsLut(p,iVar4);
            if (iVar6 != 0) {
              Gia_ObjComputeEdgeDelay(p,iVar4,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
            }
          }
        }
LAB_001e26b7:
        Vec_IntFree(pVVar7);
        goto LAB_001e26bf;
      }
    }
    for (iVar3 = 1; iVar3 < p->nObjs; iVar3 = iVar3 + 1) {
      iVar4 = Gia_ObjIsLut(p,iVar3);
      if (iVar4 != 0) {
        Gia_ObjComputeEdgeDelay(p,iVar3,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
      }
    }
  }
LAB_001e26bf:
  iVar3 = 0;
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pGVar8 = Gia_ManCo(p,iVar4);
    iVar6 = Gia_ObjFaninId0p(p,pGVar8);
    iVar6 = Vec_IntEntry(p->vEdgeDelay,iVar6);
    if (iVar3 <= iVar6) {
      iVar3 = iVar6;
    }
  }
  return iVar3;
}

Assistant:

int Gia_ManComputeEdgeDelay( Gia_Man_t * p, int fUseTwo )
{
    int k, iLut, DelayMax = 0;
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    if ( Gia_ManHasMapping(p) )
    {
        if ( p->pManTime != NULL && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) )
        {
            Gia_Obj_t * pObj; 
            Vec_Int_t * vNodes = Gia_ManOrderWithBoxes( p );
            Tim_ManIncrementTravId( (Tim_Man_t*)p->pManTime );
            Gia_ManForEachObjVec( vNodes, p, pObj, k )
            {
                iLut = Gia_ObjId( p, pObj );
                if ( Gia_ObjIsAnd(pObj) )
                {
                    if ( Gia_ObjIsLut(p, iLut) )
                        Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
                }
                else if ( Gia_ObjIsCi(pObj) )
                {
                    int arrTime = Tim_ManGetCiArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj) );
                    Vec_IntWriteEntry( p->vEdgeDelay,  iLut, arrTime );
                }
                else if ( Gia_ObjIsCo(pObj) )
                {
                    int arrTime = Vec_IntEntry( p->vEdgeDelay, Gia_ObjFaninId0(pObj, iLut) );
                    Tim_ManSetCoArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj), arrTime );
                }
                else if ( !Gia_ObjIsConst0(pObj) ) 
                    assert( 0 );
            }
            Vec_IntFree( vNodes );
        }
        else
        {
            Gia_ManForEachLut( p, iLut )
                Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        }
    }
    else if ( Gia_ManHasMapping2(p) )
    {
        if ( p->pManTime != NULL && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) )
        {
            Gia_Obj_t * pObj; 
            Vec_Int_t * vNodes = Gia_ManOrderWithBoxes( p );
            Tim_ManIncrementTravId( (Tim_Man_t*)p->pManTime );
            Gia_ManForEachObjVec( vNodes, p, pObj, k )
            {
                iLut = Gia_ObjId( p, pObj );
                if ( Gia_ObjIsAnd(pObj) )
                {
                    if ( Gia_ObjIsLut2(p, iLut) )
                        Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
                }
                else if ( Gia_ObjIsCi(pObj) )
                {
                    int arrTime = Tim_ManGetCiArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj) );
                    Vec_IntWriteEntry( p->vEdgeDelay,  iLut, arrTime );
                }
                else if ( Gia_ObjIsCo(pObj) )
                {
                    int arrTime = Vec_IntEntry( p->vEdgeDelay, Gia_ObjFaninId0(pObj, iLut) );
                    Tim_ManSetCoArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj), arrTime );
                }
                else if ( !Gia_ObjIsConst0(pObj) ) 
                    assert( 0 );
            }
            Vec_IntFree( vNodes );
        }
        else
        {
            Gia_ManForEachLut2( p, iLut )
                Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        }
    }
    else assert( 0 );
    Gia_ManForEachCoDriverId( p, iLut, k )
        DelayMax = Abc_MaxInt( DelayMax, Vec_IntEntry(p->vEdgeDelay, iLut) );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(p), DelayMax );
    return DelayMax;
}